

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2WithImpl::getDecomposition
          (Normalizer2WithImpl *this,UChar32 c,UnicodeString *decomposition)

{
  UChar this_00 [4];
  ConstChar16Ptr local_48;
  UChar *local_40;
  UChar *d;
  UChar local_30 [2];
  int32_t length;
  UChar buffer [4];
  UnicodeString *decomposition_local;
  UChar32 c_local;
  Normalizer2WithImpl *this_local;
  
  buffer = (UChar  [4])decomposition;
  local_40 = Normalizer2Impl::getDecomposition(this->impl,c,local_30,(int32_t *)((long)&d + 4));
  this_00 = buffer;
  if (local_40 == (UChar *)0x0) {
    this_local._7_1_ = '\0';
  }
  else {
    if (local_40 == local_30) {
      UnicodeString::setTo((UnicodeString *)buffer,local_30,d._4_4_);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_48,local_40);
      UnicodeString::setTo((UnicodeString *)this_00,'\0',&local_48,d._4_4_);
      ConstChar16Ptr::~ConstChar16Ptr(&local_48);
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

virtual UBool
    getDecomposition(UChar32 c, UnicodeString &decomposition) const {
        UChar buffer[4];
        int32_t length;
        const UChar *d=impl.getDecomposition(c, buffer, length);
        if(d==NULL) {
            return FALSE;
        }
        if(d==buffer) {
            decomposition.setTo(buffer, length);  // copy the string (Jamos from Hangul syllable c)
        } else {
            decomposition.setTo(FALSE, d, length);  // read-only alias
        }
        return TRUE;
    }